

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

void __thiscall flexbuffers::Builder::Write<float>(Builder *this,float val,size_t byte_width)

{
  undefined4 in_EAX;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (byte_width < 5) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,&stack0xfffffffffffffffc,
               &stack0xfffffffffffffffc + byte_width,in_R8,in_R9,CONCAT44(val,in_EAX));
    return;
  }
  __assert_fail("sizeof(T) >= byte_width",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x5a3,"void flexbuffers::Builder::Write(T, size_t) [T = float]");
}

Assistant:

void Write(T val, size_t byte_width) {
    FLATBUFFERS_ASSERT(sizeof(T) >= byte_width);
    val = flatbuffers::EndianScalar(val);
    WriteBytes(&val, byte_width);
  }